

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# randomx.cpp
# Opt level: O2

void randomx_init_cache(randomx_cache *cache,void *key,size_t keySize)

{
  bool bVar1;
  string cacheKey;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  local_40._M_string_length = 0;
  local_40.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::assign((char *)&local_40,(ulong)key);
  bVar1 = std::operator!=(&cache->cacheKey,&local_40);
  if ((bVar1) || (cache->programs[0].size == 0)) {
    (*cache->initialize)(cache,key,keySize);
    std::__cxx11::string::_M_assign((string *)&cache->cacheKey);
  }
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void randomx_init_cache(randomx_cache *cache, const void *key, size_t keySize) {
		assert(cache != nullptr);
		assert(keySize == 0 || key != nullptr);
		std::string cacheKey;
		cacheKey.assign((const char *)key, keySize);
		if (cache->cacheKey != cacheKey || !cache->isInitialized()) {
			cache->initialize(cache, key, keySize);
			cache->cacheKey = cacheKey;
		}
	}